

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void save_boundary_lines(YV12_BUFFER_CONFIG *frame,int use_highbd,int plane,AV1_COMMON *cm,
                        int after_cdef)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  AV1_COMMON *in_RCX;
  int in_EDX;
  int in_ESI;
  AV1_COMMON *in_RDI;
  int in_R8D;
  YV12_BUFFER_CONFIG *unaff_retaddr;
  int in_stack_00000010;
  RestorationStripeBoundaries *in_stack_00000018;
  int use_deblock_below;
  int use_deblock_above;
  int y1;
  int rel_y1;
  int y0;
  int rel_y0;
  int stripe_idx;
  int plane_height;
  RestorationStripeBoundaries *boundaries;
  int plane_h;
  int plane_w;
  int stripe_off;
  int stripe_height;
  int ss_y;
  int is_uv;
  int local_6c;
  int local_68;
  bool local_61;
  int local_48;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  uint local_24;
  uint local_20;
  int local_1c;
  int stripe;
  
  local_20 = (uint)(0 < in_EDX);
  local_61 = false;
  if (local_20 != 0) {
    local_61 = in_RCX->seq_params->subsampling_y != 0;
  }
  local_24 = (uint)local_61;
  local_28 = 0x40 >> local_61;
  local_2c = 8 >> local_61;
  local_1c = in_R8D;
  av1_get_upsampled_plane_size(in_RCX,local_20,&local_30,&local_34);
  iVar1 = in_RCX->height;
  bVar3 = (byte)local_24;
  local_48 = 0;
  while( true ) {
    if (local_48 * local_28 - local_2c < 0) {
      local_68 = 0;
    }
    else {
      local_68 = local_48 * local_28 - local_2c;
    }
    if (local_34 <= local_68) break;
    local_6c = (local_48 + 1) * local_28 - local_2c;
    if (local_34 <= local_6c) {
      local_6c = local_34;
    }
    bVar2 = local_6c < iVar1 + ((1 << (bVar3 & 0x1f)) >> 1) >> (bVar3 & 0x1f);
    stripe = (int)((ulong)in_RCX >> 0x20);
    if (local_1c == 0) {
      if (0 < local_48) {
        save_deblock_boundary_lines
                  (unaff_retaddr,in_RDI,in_ESI,in_EDX,stripe,(int)in_RCX,in_stack_00000010,
                   in_stack_00000018);
      }
      if (bVar2) {
        save_deblock_boundary_lines
                  (unaff_retaddr,in_RDI,in_ESI,in_EDX,(int)((ulong)in_RCX >> 0x20),(int)in_RCX,
                   in_stack_00000010,in_stack_00000018);
      }
    }
    else {
      if (0 >= local_48) {
        save_cdef_boundary_lines
                  (unaff_retaddr,in_RDI,in_ESI,in_EDX,stripe,(int)in_RCX,in_stack_00000010,
                   in_stack_00000018);
      }
      if (!bVar2) {
        save_cdef_boundary_lines
                  (unaff_retaddr,in_RDI,in_ESI,in_EDX,(int)((ulong)in_RCX >> 0x20),(int)in_RCX,
                   in_stack_00000010,in_stack_00000018);
      }
    }
    local_48 = local_48 + 1;
  }
  return;
}

Assistant:

static void save_boundary_lines(const YV12_BUFFER_CONFIG *frame, int use_highbd,
                                int plane, AV1_COMMON *cm, int after_cdef) {
  const int is_uv = plane > 0;
  const int ss_y = is_uv && cm->seq_params->subsampling_y;
  const int stripe_height = RESTORATION_PROC_UNIT_SIZE >> ss_y;
  const int stripe_off = RESTORATION_UNIT_OFFSET >> ss_y;

  int plane_w, plane_h;
  av1_get_upsampled_plane_size(cm, is_uv, &plane_w, &plane_h);

  RestorationStripeBoundaries *boundaries = &cm->rst_info[plane].boundaries;

  const int plane_height = ROUND_POWER_OF_TWO(cm->height, ss_y);

  int stripe_idx;
  for (stripe_idx = 0;; ++stripe_idx) {
    const int rel_y0 = AOMMAX(0, stripe_idx * stripe_height - stripe_off);
    const int y0 = rel_y0;
    if (y0 >= plane_h) break;

    const int rel_y1 = (stripe_idx + 1) * stripe_height - stripe_off;
    const int y1 = AOMMIN(rel_y1, plane_h);

    // Extend using CDEF pixels at the top and bottom of the frame,
    // and deblocked pixels at internal stripe boundaries
    const int use_deblock_above = (stripe_idx > 0);
    const int use_deblock_below = (y1 < plane_height);

    if (!after_cdef) {
      // Save deblocked context at internal stripe boundaries
      if (use_deblock_above) {
        save_deblock_boundary_lines(frame, cm, plane, y0 - RESTORATION_CTX_VERT,
                                    stripe_idx, use_highbd, 1, boundaries);
      }
      if (use_deblock_below) {
        save_deblock_boundary_lines(frame, cm, plane, y1, stripe_idx,
                                    use_highbd, 0, boundaries);
      }
    } else {
      // Save CDEF context at frame boundaries
      if (!use_deblock_above) {
        save_cdef_boundary_lines(frame, cm, plane, y0, stripe_idx, use_highbd,
                                 1, boundaries);
      }
      if (!use_deblock_below) {
        save_cdef_boundary_lines(frame, cm, plane, y1 - 1, stripe_idx,
                                 use_highbd, 0, boundaries);
      }
    }
  }
}